

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O1

int __thiscall
Ptex::v2_4::PtexReader::DefaultInputHandler::open
          (DefaultInputHandler *this,char *__file,int __oflag,...)

{
  FILE *__stream;
  char *__buf;
  
  __stream = fopen(__file,"rb");
  if (__stream == (FILE *)0x0) {
    this->buffer = (char *)0x0;
  }
  else {
    __buf = (char *)operator_new__(0x2000);
    this->buffer = __buf;
    setvbuf(__stream,__buf,0,0x2000);
  }
  return (int)__stream;
}

Assistant:

virtual Handle open(const char* path) {
            FILE* fp = fopen(path, "rb");
            if (fp) {
                buffer = new char [IBuffSize];
                setvbuf(fp, buffer, _IOFBF, IBuffSize);
            }
            else buffer = 0;
            return (Handle) fp;
        }